

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdMath.cpp
# Opt level: O2

Object * __thiscall CmdMath::execute(CmdMath *this,Engine *engine)

{
  int value;
  int iVar1;
  ObjectInt *this_00;
  runtime_error *this_01;
  ulong uVar2;
  
  if (this->blocksCount != 0) {
    value = executeInt(*this->blocks,engine);
    uVar2 = 1;
    do {
      if (this->blocksCount <= uVar2) {
        this_00 = (ObjectInt *)operator_new(0x10);
        ObjectInt::ObjectInt(this_00,value);
        return &this_00->super_Object;
      }
      switch(this->operation) {
      case PLUS:
        iVar1 = executeInt(this->blocks[uVar2],engine);
        value = value + iVar1;
        break;
      case MINUS:
        iVar1 = executeInt(this->blocks[uVar2],engine);
        value = value - iVar1;
        break;
      case MULTIPLY:
        iVar1 = executeInt(this->blocks[uVar2],engine);
        value = value * iVar1;
        break;
      case DIVIDE:
        iVar1 = executeInt(this->blocks[uVar2],engine);
        value = value / iVar1;
        break;
      default:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"CmdMath::execute => unknown operation!");
        goto LAB_001062b4;
      }
      uVar2 = uVar2 + 1;
    } while( true );
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"CmdMath::execute => no blocks!");
LAB_001062b4:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object *CmdMath::execute(Engine *engine) {
	if (this->blocksCount == 0) {
		throw std::runtime_error("CmdMath::execute => no blocks!");
	}
	
	int result = executeInt(this->blocks[0], engine);
	unsigned int i;
	for (i = 1; i < this->blocksCount; i++) {
		switch (this->operation) {
			case PLUS:
				result += executeInt(this->blocks[i], engine);
				break;
			case MINUS:
				result -= executeInt(this->blocks[i], engine);
				break;
			case MULTIPLY:
				result *= executeInt(this->blocks[i], engine);
				break;
			case DIVIDE:
				result /= executeInt(this->blocks[i], engine);
				break;
			default:
				throw std::runtime_error("CmdMath::execute => unknown operation!");
		}
	}
	return new ObjectInt(result);
}